

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O2

void duckdb::SetArrowFormat
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *child,LogicalType *type,
               ClientProperties *options,ClientContext *context)

{
  _List_node_base *p_Var1;
  ArrowSchema *pAVar2;
  ArrowSchema **ppAVar3;
  value_type pAVar4;
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  *pvVar5;
  ClientProperties *options_00;
  bool bVar6;
  PhysicalType PVar7;
  char *pcVar8;
  reference pvVar9;
  idx_t __val;
  LogicalType *pLVar10;
  reference pvVar11;
  reference ppAVar12;
  long lVar13;
  const_reference pvVar14;
  NotImplementedException *this;
  InternalException *this_00;
  char *pcVar15;
  LogicalType *type_00;
  idx_t type_idx;
  ulong uVar16;
  uint8_t scale;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string format;
  uint8_t width;
  string local_c8;
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  *local_a8;
  ClientProperties *local_a0;
  ClientContext *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  bVar6 = LogicalType::HasAlias(type);
  if ((bVar6) &&
     (((bVar6 = LogicalType::IsJSONType(type), !bVar6 ||
       (options->arrow_lossless_conversion == true)) &&
      (bVar6 = SetArrowExtension(root_holder,child,type,context), bVar6)))) {
    return;
  }
  switch(type->id_) {
  case SQLNULL:
    pcVar8 = "n";
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case UHUGEINT:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_008b8a94_caseD_2:
    bVar6 = SetArrowExtension(root_holder,child,type,context);
    if (bVar6) {
      return;
    }
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&format,"Unsupported Arrow type %s",(allocator *)&local_110);
    LogicalType::ToString_abi_cxx11_(&local_50,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>(this,&format,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    if (options->arrow_lossless_conversion == true) {
LAB_008b8cf4:
      SetArrowExtension(root_holder,child,type,context);
      return;
    }
    pcVar8 = "b";
    break;
  case TINYINT:
    pcVar8 = "c";
    break;
  case SMALLINT:
    pcVar8 = "s";
    break;
  case INTEGER:
    pcVar8 = "i";
    break;
  case BIGINT:
    pcVar8 = "l";
    break;
  case DATE:
    pcVar8 = "tdD";
    break;
  case TIMESTAMP_SEC:
    pcVar8 = "tss:";
    break;
  case TIMESTAMP_MS:
    pcVar8 = "tsm:";
    break;
  case TIMESTAMP:
    pcVar8 = "tsu:";
    break;
  case TIMESTAMP_NS:
    pcVar8 = "tsn:";
    break;
  case DECIMAL:
    LogicalType::GetDecimalProperties(type,&width,&scale);
    ::std::__cxx11::to_string(&local_c8,(uint)width);
    ::std::operator+(&local_90,"d:",&local_c8);
    ::std::operator+(&local_110,&local_90,",");
    ::std::__cxx11::to_string(&local_70,(uint)scale);
    ::std::operator+(&format,&local_110,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_c8);
    AddName((duckdb *)&local_110,&format);
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&root_holder->owned_type_names,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_110);
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_110);
    pvVar9 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                       (&root_holder->owned_type_names);
    goto LAB_008b8d74;
  case FLOAT:
    pcVar8 = "f";
    break;
  case DOUBLE:
    pcVar8 = "g";
    break;
  case VARCHAR:
    goto switchD_008b8a94_caseD_19;
  case BLOB:
    goto switchD_008b8a94_caseD_1a;
  case INTERVAL:
    pcVar8 = "tin";
    break;
  case UTINYINT:
    pcVar8 = "C";
    break;
  case USMALLINT:
    pcVar8 = "S";
    break;
  case UINTEGER:
    pcVar8 = "I";
    break;
  case UBIGINT:
    pcVar8 = "L";
    break;
  case TIMESTAMP_TZ:
    ::std::operator+(&format,"tsu:",&options->time_zone);
    AddName((duckdb *)&local_110,&format);
    ::std::
    vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
    ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
              ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                *)&root_holder->owned_type_names,
               (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_110);
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_110);
    pvVar9 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                       (&root_holder->owned_type_names);
LAB_008b8d74:
    child->format =
         (pvVar9->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
LAB_008b928c:
    ::std::__cxx11::string::~string((string *)&format);
    return;
  case TIME_TZ:
    if (options->arrow_lossless_conversion == true) goto LAB_008b8cf4;
  case TIME:
    pcVar8 = "ttu";
    break;
  case BIT:
    if (options->arrow_lossless_conversion == true) goto LAB_008b8cf4;
    goto switchD_008b8a94_caseD_1a;
  case HUGEINT:
    if (options->arrow_lossless_conversion == true) goto LAB_008b8cf4;
    pcVar8 = "d:38,0";
    break;
  case UUID:
    if (options->arrow_lossless_conversion == true) goto LAB_008b8cf4;
    goto switchD_008b8a94_caseD_19;
  default:
    local_a0 = options;
    switch(type->id_) {
    case STRUCT:
      SetArrowStructFormat(root_holder,child,type,options,context,false);
      return;
    case LIST:
      bVar6 = options->arrow_offset_size == LARGE;
      pcVar8 = "+vl";
      if (bVar6) {
        pcVar8 = "+vL";
      }
      pcVar15 = "+l";
      if (bVar6) {
        pcVar15 = "+L";
      }
      if (options->arrow_use_list_view != false) {
        pcVar15 = pcVar8;
      }
      child->format = pcVar15;
      child->n_children = 1;
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>::
      emplace_back<>(&root_holder->nested_children);
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
      ::emplace_back<>(&root_holder->nested_children_ptr);
      p_Var1 = (root_holder->nested_children_ptr).
               super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
      format._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::get<true>
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::emplace_back<ArrowSchema*>
                ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var1 + 1),
                 (ArrowSchema **)&format);
      pvVar11 = vector<ArrowSchema,_true>::get<true>
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      ::std::__cxx11::string::string
                ((string *)&format,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_110);
      InitializeChild(pvVar11,root_holder,&format);
      ::std::__cxx11::string::~string((string *)&format);
      ppAVar12 = vector<ArrowSchema_*,_true>::get<true>
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar12;
      (*ppAVar12)->name = "l";
      pAVar2 = *ppAVar12;
      pLVar10 = ListType::GetChildType(type);
      SetArrowFormat(root_holder,pAVar2,pLVar10,options,context);
      return;
    case MAP:
      SetArrowMapFormat(root_holder,child,type,options,context);
      return;
    default:
      goto switchD_008b8a94_caseD_2;
    case ENUM:
      PVar7 = EnumType::GetPhysicalType(type);
      if (PVar7 == UINT8) {
        pcVar8 = "C";
      }
      else if (PVar7 == UINT32) {
        pcVar8 = "I";
      }
      else {
        if (PVar7 != UINT16) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&format,"Unsupported Enum Internal Type",(allocator *)&local_110);
          InternalException::InternalException(this_00,&format);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pcVar8 = "S";
      }
      child->format = pcVar8;
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>::
      emplace_back<>(&root_holder->nested_children);
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
      ::emplace_back<>(&root_holder->nested_children_ptr);
      p_Var1 = (root_holder->nested_children_ptr).
               super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
      format._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::get<true>
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::emplace_back<ArrowSchema*>
                ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var1 + 1),
                 (ArrowSchema **)&format);
      pvVar11 = vector<ArrowSchema,_true>::get<true>
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      ::std::__cxx11::string::string
                ((string *)&format,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_110);
      InitializeChild(pvVar11,root_holder,&format);
      ::std::__cxx11::string::~string((string *)&format);
      ppAVar12 = vector<ArrowSchema_*,_true>::get<true>
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      pAVar4 = *ppAVar12;
      child->dictionary = pAVar4;
      pAVar4->format = "u";
      return;
    case UNION:
      ::std::__cxx11::string::string((string *)&format,"+us:",(allocator *)&local_110);
      UnionType::CopyMemberTypes_abi_cxx11_
                ((child_list_t<LogicalType> *)&local_c8,(UnionType *)type,type_00);
      lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                         ((long)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p) / 0x38
                         );
      child->n_children = lVar13;
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>::
      emplace_back<>(&root_holder->nested_children);
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 (long)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p) / 0x38);
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
      ::emplace_back<>(&root_holder->nested_children_ptr);
      ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::resize
                ((vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_> *)
                 ((root_holder->nested_children_ptr).
                  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 (long)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p) / 0x38);
      for (uVar16 = 0;
          uVar16 < (ulong)((long)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p) /
                          0x38); uVar16 = uVar16 + 1) {
        pvVar11 = vector<ArrowSchema,_true>::get<true>
                            ((vector<ArrowSchema,_true> *)
                             ((root_holder->nested_children).
                              super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                              ._M_impl._M_node.super__List_node_base._M_prev + 1),uVar16);
        ppAVar12 = vector<ArrowSchema_*,_true>::get<true>
                             ((vector<ArrowSchema_*,_true> *)
                              ((root_holder->nested_children_ptr).
                               super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                               ._M_impl._M_node.super__List_node_base._M_prev + 1),uVar16);
        *ppAVar12 = pvVar11;
      }
      ppAVar12 = vector<ArrowSchema_*,_true>::get<true>
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar12;
      local_a8 = (vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)&root_holder->owned_type_names;
      local_98 = context;
      for (uVar16 = 0;
          uVar16 < (ulong)((long)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p) /
                          0x38); uVar16 = uVar16 + 1) {
        pAVar2 = child->children[uVar16];
        ::std::__cxx11::string::string
                  ((string *)&local_110,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_90);
        InitializeChild(pAVar2,root_holder,&local_110);
        ::std::__cxx11::string::~string((string *)&local_110);
        pvVar14 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  ::get<true>((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                               *)&local_c8,uVar16);
        AddName((duckdb *)&local_110,&pvVar14->first);
        pvVar5 = local_a8;
        ::std::
        vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
        ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                  (local_a8,(unique_ptr<char[],_std::default_delete<char>,_false> *)&local_110);
        ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_110);
        pvVar9 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                           ((vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>
                             *)pvVar5);
        ppAVar3 = child->children;
        ppAVar3[uVar16]->name =
             (pvVar9->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        pAVar2 = ppAVar3[uVar16];
        pvVar14 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  ::get<true>((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                               *)&local_c8,uVar16);
        SetArrowFormat(root_holder,pAVar2,&pvVar14->second,local_a0,local_98);
        ::std::__cxx11::to_string(&local_90,uVar16);
        ::std::operator+(&local_110,&local_90,",");
        ::std::__cxx11::string::append((string *)&format);
        ::std::__cxx11::string::~string((string *)&local_110);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      ::std::__cxx11::string::pop_back();
      AddName((duckdb *)&local_110,&format);
      pvVar5 = local_a8;
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                (local_a8,(unique_ptr<char[],_std::default_delete<char>,_false> *)&local_110);
      ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_110);
      pvVar9 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                         ((vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>
                           *)pvVar5);
      child->format =
           (pvVar9->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_c8);
      break;
    case ARRAY:
      __val = ArrayType::GetSize(type);
      pLVar10 = ArrayType::GetChildType(type);
      ::std::__cxx11::to_string(&local_110,__val);
      ::std::operator+(&format,"+w:",&local_110);
      ::std::__cxx11::string::~string((string *)&local_110);
      AddName((duckdb *)&local_110,&format);
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)&root_holder->owned_type_names,
                 (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_110);
      options_00 = local_a0;
      ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_110);
      pvVar9 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                         (&root_holder->owned_type_names);
      child->format =
           (pvVar9->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
           super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      child->n_children = 1;
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>::
      emplace_back<>(&root_holder->nested_children);
      ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
                ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)
                 ((root_holder->nested_children).
                  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),1);
      ::std::__cxx11::
      list<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
      ::emplace_back<>(&root_holder->nested_children_ptr);
      p_Var1 = (root_holder->nested_children_ptr).
               super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
      local_110._M_dataplus._M_p =
           (pointer)vector<ArrowSchema,_true>::get<true>
                              ((vector<ArrowSchema,_true> *)
                               ((root_holder->nested_children).
                                super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      ::std::vector<ArrowSchema*,std::allocator<ArrowSchema*>>::emplace_back<ArrowSchema*>
                ((vector<ArrowSchema*,std::allocator<ArrowSchema*>> *)(p_Var1 + 1),
                 (ArrowSchema **)&local_110);
      pvVar11 = vector<ArrowSchema,_true>::get<true>
                          ((vector<ArrowSchema,_true> *)
                           ((root_holder->nested_children).
                            super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      ::std::__cxx11::string::string
                ((string *)&local_110,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_90);
      InitializeChild(pvVar11,root_holder,&local_110);
      ::std::__cxx11::string::~string((string *)&local_110);
      ppAVar12 = vector<ArrowSchema_*,_true>::get<true>
                           ((vector<ArrowSchema_*,_true> *)
                            ((root_holder->nested_children_ptr).
                             super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
                             ._M_impl._M_node.super__List_node_base._M_prev + 1),0);
      child->children = ppAVar12;
      SetArrowFormat(root_holder,*ppAVar12,pLVar10,options_00,context);
    }
    goto LAB_008b928c;
  }
LAB_008b933a:
  child->format = pcVar8;
  return;
switchD_008b8a94_caseD_1a:
  if (options->arrow_offset_size == LARGE) {
    pcVar8 = "Z";
  }
  else {
    pcVar8 = "z";
  }
  goto LAB_008b933a;
switchD_008b8a94_caseD_19:
  if (options->produce_arrow_string_view == true) {
    pcVar8 = "vu";
  }
  else if (options->arrow_offset_size == LARGE) {
    pcVar8 = "U";
  }
  else {
    pcVar8 = "u";
  }
  goto LAB_008b933a;
}

Assistant:

void SetArrowFormat(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &child, const LogicalType &type,
                    ClientProperties &options, ClientContext &context) {
	if (type.HasAlias()) {
		// If it is a json type, we only export it as json if arrow_lossless_conversion = True
		if (!(type.IsJSONType() && !options.arrow_lossless_conversion)) {
			// If the type has an alias, we check if it is an Arrow-Type extension
			if (SetArrowExtension(root_holder, child, type, context)) {
				return;
			}
		}
	}
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "b";
		}
		break;
	case LogicalTypeId::TINYINT:
		child.format = "c";
		break;
	case LogicalTypeId::SMALLINT:
		child.format = "s";
		break;
	case LogicalTypeId::INTEGER:
		child.format = "i";
		break;
	case LogicalTypeId::BIGINT:
		child.format = "l";
		break;
	case LogicalTypeId::UTINYINT:
		child.format = "C";
		break;
	case LogicalTypeId::USMALLINT:
		child.format = "S";
		break;
	case LogicalTypeId::UINTEGER:
		child.format = "I";
		break;
	case LogicalTypeId::UBIGINT:
		child.format = "L";
		break;
	case LogicalTypeId::FLOAT:
		child.format = "f";
		break;
	case LogicalTypeId::HUGEINT: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "d:38,0";
		}
		break;
	}
	case LogicalTypeId::DOUBLE:
		child.format = "g";
		break;
	case LogicalTypeId::UUID: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			if (options.produce_arrow_string_view) {
				child.format = "vu";
			} else {
				if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
					child.format = "U";
				} else {
					child.format = "u";
				}
			}
		}
		break;
	}
	case LogicalTypeId::VARCHAR:
		if (options.produce_arrow_string_view) {
			child.format = "vu";
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "U";
			} else {
				child.format = "u";
			}
		}
		break;
	case LogicalTypeId::DATE:
		child.format = "tdD";
		break;
	case LogicalTypeId::TIME_TZ: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			child.format = "ttu";
		}
		break;
	}
	case LogicalTypeId::TIME:
		child.format = "ttu";
		break;
	case LogicalTypeId::TIMESTAMP:
		child.format = "tsu:";
		break;
	case LogicalTypeId::TIMESTAMP_TZ: {
		string format = "tsu:" + options.time_zone;
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();
		break;
	}
	case LogicalTypeId::TIMESTAMP_SEC:
		child.format = "tss:";
		break;
	case LogicalTypeId::TIMESTAMP_NS:
		child.format = "tsn:";
		break;
	case LogicalTypeId::TIMESTAMP_MS:
		child.format = "tsm:";
		break;
	case LogicalTypeId::INTERVAL:
		child.format = "tin";
		break;
	case LogicalTypeId::DECIMAL: {
		uint8_t width, scale;
		type.GetDecimalProperties(width, scale);
		string format = "d:" + to_string(width) + "," + to_string(scale);
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();
		break;
	}
	case LogicalTypeId::SQLNULL: {
		child.format = "n";
		break;
	}
	case LogicalTypeId::BLOB:
		if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
			child.format = "Z";
		} else {
			child.format = "z";
		}
		break;
	case LogicalTypeId::BIT: {
		if (options.arrow_lossless_conversion) {
			SetArrowExtension(root_holder, child, type, context);
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "Z";
			} else {
				child.format = "z";
			}
		}

		break;
	}
	case LogicalTypeId::LIST: {
		if (options.arrow_use_list_view) {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "+vL";
			} else {
				child.format = "+vl";
			}
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				child.format = "+L";
			} else {
				child.format = "+l";
			}
		}
		child.n_children = 1;
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.children = &root_holder.nested_children_ptr.back()[0];
		child.children[0]->name = "l";
		SetArrowFormat(root_holder, **child.children, ListType::GetChildType(type), options, context);
		break;
	}
	case LogicalTypeId::STRUCT: {
		SetArrowStructFormat(root_holder, child, type, options, context);
		break;
	}
	case LogicalTypeId::ARRAY: {
		auto array_size = ArrayType::GetSize(type);
		auto &child_type = ArrayType::GetChildType(type);
		auto format = "+w:" + to_string(array_size);
		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();

		child.n_children = 1;
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.children = &root_holder.nested_children_ptr.back()[0];
		SetArrowFormat(root_holder, **child.children, child_type, options, context);
		break;
	}
	case LogicalTypeId::MAP: {
		SetArrowMapFormat(root_holder, child, type, options, context);
		break;
	}
	case LogicalTypeId::UNION: {
		std::string format = "+us:";

		auto &child_types = UnionType::CopyMemberTypes(type);
		child.n_children = NumericCast<int64_t>(child_types.size());
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(child_types.size());
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().resize(child_types.size());
		for (idx_t type_idx = 0; type_idx < child_types.size(); type_idx++) {
			root_holder.nested_children_ptr.back()[type_idx] = &root_holder.nested_children.back()[type_idx];
		}
		child.children = &root_holder.nested_children_ptr.back()[0];
		for (size_t type_idx = 0; type_idx < child_types.size(); type_idx++) {

			InitializeChild(*child.children[type_idx], root_holder);

			root_holder.owned_type_names.push_back(AddName(child_types[type_idx].first));

			child.children[type_idx]->name = root_holder.owned_type_names.back().get();
			SetArrowFormat(root_holder, *child.children[type_idx], child_types[type_idx].second, options, context);

			format += to_string(type_idx) + ",";
		}

		format.pop_back();

		root_holder.owned_type_names.push_back(AddName(format));
		child.format = root_holder.owned_type_names.back().get();

		break;
	}
	case LogicalTypeId::ENUM: {
		// TODO what do we do with pointer enums here?
		switch (EnumType::GetPhysicalType(type)) {
		case PhysicalType::UINT8:
			child.format = "C";
			break;
		case PhysicalType::UINT16:
			child.format = "S";
			break;
		case PhysicalType::UINT32:
			child.format = "I";
			break;
		default:
			throw InternalException("Unsupported Enum Internal Type");
		}
		root_holder.nested_children.emplace_back();
		root_holder.nested_children.back().resize(1);
		root_holder.nested_children_ptr.emplace_back();
		root_holder.nested_children_ptr.back().push_back(&root_holder.nested_children.back()[0]);
		InitializeChild(root_holder.nested_children.back()[0], root_holder);
		child.dictionary = root_holder.nested_children_ptr.back()[0];
		child.dictionary->format = "u";
		break;
	}
	default: {
		// It is possible we can export this type as a registered extension
		auto success = SetArrowExtension(root_holder, child, type, context);
		if (!success) {
			throw NotImplementedException("Unsupported Arrow type %s", type.ToString());
		}
	}
	}
}